

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgemm.hpp
# Opt level: O0

void remora::bindings::ugemm<remora::bindings::gemm_block_size<double>,double,double>
               (size_t kc,double alpha,double *A,double *B,double *C,size_t stride1,size_t stride2)

{
  long in_RCX;
  long lVar1;
  long in_RDX;
  long in_RSI;
  ulong in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  size_t j_2;
  size_t i_2;
  double *p;
  size_t j_1;
  size_t i_1;
  size_t j;
  size_t i;
  size_t l;
  vx *b;
  size_t c;
  double *P;
  type Pa;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  ulong local_1a0;
  long local_198;
  ulong local_190;
  double local_180 [35];
  long local_68;
  
  for (local_190 = 0; local_190 < 0x18; local_190 = local_190 + 1) {
    local_180[local_190] = 0.0;
  }
  local_198 = in_RDX;
  local_68 = in_RSI;
  for (local_1a0 = 0; local_1a0 < in_RDI; local_1a0 = local_1a0 + 1) {
    for (local_1a8 = 0; local_1a8 < 4; local_1a8 = local_1a8 + 1) {
      for (local_1b0 = 0; local_1b0 < 6; local_1b0 = local_1b0 + 1) {
        lVar1 = local_1a8 * 6 + local_1b0;
        local_180[lVar1] =
             *(double *)(local_68 + local_1a8 * 8) * *(double *)(local_198 + local_1b0 * 8) +
             local_180[lVar1];
      }
    }
    local_68 = local_68 + 0x20;
    local_198 = local_198 + 0x30;
  }
  if ((in_XMM0_Qa != 1.0) || (NAN(in_XMM0_Qa))) {
    for (local_1b8 = 0; local_1b8 < 4; local_1b8 = local_1b8 + 1) {
      for (local_1c0 = 0; local_1c0 < 6; local_1c0 = local_1c0 + 1) {
        lVar1 = local_1b8 * 6 + local_1c0;
        local_180[lVar1] = in_XMM0_Qa * local_180[lVar1];
      }
    }
  }
  for (local_1d0 = 0; local_1d0 < 4; local_1d0 = local_1d0 + 1) {
    for (local_1d8 = 0; local_1d8 < 6; local_1d8 = local_1d8 + 1) {
      lVar1 = local_1d0 * in_R8 + local_1d8 * in_R9;
      *(double *)(in_RCX + lVar1 * 8) =
           local_180[local_1d0 * 6 + local_1d8] + *(double *)(in_RCX + lVar1 * 8);
    }
  }
  return;
}

Assistant:

void ugemm(
	std::size_t kc, TC alpha, T const* A, T const* B,
	TC* C, std::size_t stride1, std::size_t stride2
){
	BOOST_ALIGN_ASSUME_ALIGNED(A, block_size::block::align);
	BOOST_ALIGN_ASSUME_ALIGNED(B, block_size::block::align);

	typedef typename block_size::block::type vx;
	static const std::size_t vector_length = block_size::block::vector_elements;
	static const std::size_t vecNR = block_size::nr/vector_length;
#ifdef REMORA_USE_SIMD
	vx P[block_size::mr * vecNR] = {};
#else
	typename std::aligned_storage<sizeof(vx[block_size::mr*vecNR]),block_size::block::align>::type Pa;
	T* P = reinterpret_cast<T*>(&Pa);
	for (std::size_t c = 0; c < block_size::mr*vecNR; c++)
		P[c] = 0;
#endif


	// perform the matrix-matrix product as outer product
	// of rows of A and B
	vx const* b = (vx const*)B;
	for (std::size_t l=0; l<kc; ++l) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j<vecNR; ++j) {
				P[i * vecNR+j] += A[i]*b[j];
			}
		}
		A += block_size::mr;
		b += vecNR;
	}
	//multiply with alpha if necessary
	if (alpha!=TC(1)) {
		for (std::size_t i=0; i<block_size::mr; ++i) {
			for (std::size_t j=0; j< vecNR; ++j) {
				P[i*vecNR+j] *= alpha;
			}
		}
	}

	//add result to C
	T const* p = (T const*) P;
	for (std::size_t i=0; i<block_size::mr; ++i) {
		for (std::size_t j=0; j<block_size::nr; ++j) {
			C[i * stride1+j * stride2] += p[i*block_size::nr+j];
		}
	}
}